

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_node.c
# Opt level: O1

PVIPNode *
PVIP_node_append_string_from_oct(PVIPParserContext *parser,PVIPNode *node,char *str,size_t len)

{
  PVIP_category_t PVar1;
  undefined8 in_RAX;
  long lVar2;
  PVIPNode *pPVar3;
  char c;
  char buf [3];
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  PVar1 = PVIP_node_category(node->type);
  if (PVar1 != PVIP_CATEGORY_STRING) {
    __assert_fail("PVIP_node_category(node->type) == PVIP_CATEGORY_STRING",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/src/pvip_node.c"
                  ,0xa1,
                  "PVIPNode *PVIP_node_append_string_from_oct(PVIPParserContext *, PVIPNode *, const char *, size_t)"
                 );
  }
  if (len == 2) {
    uStack_28 = (ulong)CONCAT16(str[1],CONCAT15(*str,(undefined5)uStack_28));
    lVar2 = strtol((char *)((long)&uStack_28 + 5),(char **)0x0,8);
    uStack_28._0_5_ = CONCAT14((char)lVar2,(undefined4)uStack_28);
    pPVar3 = PVIP_node_append_string(parser,node,(char *)((long)&uStack_28 + 4),1);
    return pPVar3;
  }
  __assert_fail("len==2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/src/pvip_node.c"
                ,0xa2,
                "PVIPNode *PVIP_node_append_string_from_oct(PVIPParserContext *, PVIPNode *, const char *, size_t)"
               );
}

Assistant:

PVIPNode* PVIP_node_append_string_from_oct(PVIPParserContext *parser, PVIPNode *node, const char* str, size_t len) {
    assert(PVIP_node_category(node->type) == PVIP_CATEGORY_STRING);
    assert(len==2);

    char buf[3];
    buf[0] = str[0];
    buf[1] = str[1];
    buf[2] = '\0';
    char c = strtol(buf, NULL, 8);
    return PVIP_node_append_string(parser, node, &c, 1);
}